

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  ImGuiInputEvent *pIVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  ImGuiInputEvent *__dest;
  int iVar7;
  long lVar8;
  anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *paVar9;
  ImGuiContext *g;
  int iVar10;
  
  pIVar6 = GImGui;
  if (key == 0) {
    return;
  }
  this->BackendUsingLegacyKeyArrays = '\0';
  if (key - 0x269U < 0x18) {
    this->BackendUsingLegacyNavInputArray = false;
  }
  iVar10 = key;
  if (((uint)key < 0x200) && (iVar10 = (pIVar6->IO).KeyMap[(uint)key], iVar10 == -1)) {
    iVar10 = key;
  }
  if ((pIVar6->IO).KeysData[iVar10].Down == down) {
    fVar2 = (pIVar6->IO).KeysData[iVar10].AnalogValue;
    if ((fVar2 == analog_value) && (!NAN(fVar2) && !NAN(analog_value))) {
      lVar8 = (long)(pIVar6->InputEventsQueue).Size;
      if (lVar8 < 1) {
        return;
      }
      paVar9 = &(pIVar6->InputEventsQueue).Data[lVar8 + -1].field_2;
      bVar5 = false;
      do {
        if ((((ImGuiInputEvent *)((long)paVar9 + -8))->Type == ImGuiInputEventType_Key) &&
           ((paVar9->MouseButton).Button == key)) {
          bVar5 = true;
        }
        if (lVar8 < 2) break;
        paVar9 = paVar9 + -2;
        lVar8 = lVar8 + -1;
      } while (!bVar5);
      if (!bVar5) {
        return;
      }
    }
  }
  iVar10 = (pIVar6->InputEventsQueue).Size;
  iVar3 = (pIVar6->InputEventsQueue).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar7) {
      iVar10 = iVar7;
    }
    if (iVar3 < iVar10) {
      if (pIVar6 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar10 * 0x18,GImAllocatorUserData)
      ;
      pIVar4 = (pIVar6->InputEventsQueue).Data;
      if (pIVar4 != (ImGuiInputEvent *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar6->InputEventsQueue).Size * 0x18);
        pIVar4 = (pIVar6->InputEventsQueue).Data;
        if ((pIVar4 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar6->InputEventsQueue).Data = __dest;
      (pIVar6->InputEventsQueue).Capacity = iVar10;
    }
  }
  pIVar4 = (pIVar6->InputEventsQueue).Data;
  iVar10 = (pIVar6->InputEventsQueue).Size;
  pIVar4[iVar10].Type = ImGuiInputEventType_Key;
  pIVar4[iVar10].Source = (key - 0x269U < 0x18) + ImGuiInputSource_Keyboard;
  pIVar4[iVar10].field_2.Key.Key = key;
  pIVar4[iVar10].field_2.MouseButton.Down = down;
  *(undefined2 *)((long)&pIVar4[iVar10].field_2 + 5) = 0;
  *(undefined1 *)((long)&pIVar4[iVar10].field_2 + 7) = 0;
  pIVar4[iVar10].field_2.Key.AnalogValue = analog_value;
  *(undefined4 *)&pIVar4[iVar10].AddedByTestEngine = 0;
  (pIVar6->InputEventsQueue).Size = (pIVar6->InputEventsQueue).Size + 1;
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}